

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::option(Fl_Option opt,bool val)

{
  bool val_local;
  Fl_Option opt_local;
  
  if ((-1 < (int)opt) && ((int)opt < 5)) {
    if (options_read_ == '\0') {
      option(opt);
    }
    options_[opt] = val;
  }
  return;
}

Assistant:

void Fl::option(Fl_Option opt, bool val)
{
  if (opt<0 || opt>=OPTION_LAST)
    return;
  if (!options_read_) {
    // first read this option, so we don't override our setting later
    option(opt);
  }
  options_[opt] = val;
}